

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O1

void __thiscall midi_container::split_by_instrument_changes(midi_container *this,split_callback cb)

{
  midi_event *p_event;
  vector<midi_track,_std::allocator<midi_track>_> *this_00;
  long lVar1;
  uint8_t *puVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  long lVar8;
  long lVar9;
  uint8_t uVar10;
  midi_track *this_01;
  uint8_t uVar11;
  uint8_t uVar12;
  ulong p_timestamp;
  bool bVar13;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  midi_track output_track;
  midi_track program_change;
  string name;
  midi_track source_track;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  value_type local_f8;
  split_callback local_e0;
  midi_track local_d8;
  string local_c0;
  long local_a0;
  long local_98;
  midi_track local_90;
  undefined1 local_78 [16];
  pointer local_68;
  pointer local_50;
  pointer local_40;
  
  if ((this->m_form == 1) &&
     (lVar1 = (long)(this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                    _M_impl.super__Vector_impl_data._M_start, lVar1 != 0)) {
    this_00 = &this->m_tracks;
    local_a0 = (lVar1 >> 3) * -0x5555555555555555;
    local_a0 = local_a0 + (ulong)(local_a0 == 0);
    local_98 = 0;
    local_e0 = cb;
    do {
      midi_track::midi_track
                (&local_90,
                 (this_00->super__Vector_base<midi_track,_std::allocator<midi_track>_>)._M_impl.
                 super__Vector_impl_data._M_start);
      std::vector<midi_track,_std::allocator<midi_track>_>::_M_erase
                (this_00,(this_00->super__Vector_base<midi_track,_std::allocator<midi_track>_>).
                         _M_impl.super__Vector_impl_data._M_start);
      local_f8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((long)local_90.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_90.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                _M_impl.super__Vector_impl_data._M_start != 0) {
        lVar1 = (long)local_90.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_90.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 6;
        lVar8 = 0;
        do {
          p_event = local_90.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar8;
          this_01 = &local_d8;
          if ((local_90.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl
               .super__Vector_impl_data._M_start[lVar8].m_type != program_change) &&
             (((local_90.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar8].m_type != control_change ||
               ((p_event->m_data[0] & 0xdf) != 0)) &&
              (this_01 = &local_f8,
              local_d8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_d8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
              super__Vector_impl_data._M_start)))) {
            if (local_f8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                local_f8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              std::vector<midi_track,_std::allocator<midi_track>_>::push_back(this_00,&local_f8);
            }
            std::vector<midi_event,_std::allocator<midi_event>_>::operator=
                      (&local_f8.m_events,&local_d8.m_events);
            if (local_e0 != (split_callback)0x0) {
              uVar4 = (uint)((ulong)((long)local_d8.m_events.
                                           super__Vector_base<midi_event,_std::allocator<midi_event>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_d8.m_events.
                                          super__Vector_base<midi_event,_std::allocator<midi_event>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 6);
              if ((int)uVar4 < 1) {
                uVar7 = '\0';
                uVar10 = '\0';
                uVar12 = '\0';
                p_timestamp = 0;
              }
              else {
                uVar5 = (ulong)(uVar4 & 0x7fffffff);
                puVar2 = (local_d8.m_events.
                          super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_data + 1;
                p_timestamp = 0;
                uVar10 = '\0';
                uVar6 = '\0';
                uVar11 = '\0';
                do {
                  uVar12 = puVar2[-1];
                  uVar7 = uVar6;
                  if ((*(event_type *)(puVar2 + -0x11) != program_change) &&
                     (bVar13 = uVar12 != '\0', uVar7 = *puVar2, uVar12 = uVar11, bVar13)) {
                    uVar7 = uVar6;
                    uVar10 = *puVar2;
                  }
                  if (p_timestamp < ((midi_event *)(puVar2 + -0x19))->m_timestamp) {
                    p_timestamp = ((midi_event *)(puVar2 + -0x19))->m_timestamp;
                  }
                  puVar2 = puVar2 + 0x40;
                  uVar5 = uVar5 - 1;
                  uVar6 = uVar7;
                  uVar11 = uVar12;
                } while (uVar5 != 0);
              }
              (*local_e0)(&local_c0,uVar7,uVar10,uVar12);
              local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (uint8_t *)0x0;
              local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        (&local_118,local_c0._M_string_length + 2);
              *local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start = 0xff;
              local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[1] = '\x03';
              if (0 < (long)local_c0._M_string_length) {
                lVar3 = local_c0._M_string_length + 1;
                lVar9 = 0;
                do {
                  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar9 + 2] =
                       local_c0._M_dataplus._M_p[lVar9];
                  lVar3 = lVar3 + -1;
                  lVar9 = lVar9 + 1;
                } while (1 < lVar3);
              }
              midi_event::midi_event
                        ((midi_event *)local_78,p_timestamp,extended,0,
                         local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (long)local_118.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_118.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
              midi_track::add_event(&local_f8,(midi_event *)local_78);
              if (local_50 != (pointer)0x0) {
                operator_delete(local_50,(long)local_40 - (long)local_50);
              }
              if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (uint8_t *)0x0) {
                operator_delete(local_118.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_118.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_118.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1
                               );
              }
            }
            this_01 = &local_f8;
            local_78._0_8_ = (pointer)0x0;
            local_78._8_8_ = (pointer)0x0;
            local_68 = (pointer)0x0;
            std::vector<midi_event,_std::allocator<midi_event>_>::operator=
                      (&local_d8.m_events,
                       (vector<midi_event,_std::allocator<midi_event>_> *)local_78);
            std::vector<midi_event,_std::allocator<midi_event>_>::~vector
                      ((vector<midi_event,_std::allocator<midi_event>_> *)local_78);
          }
          midi_track::add_event(this_01,p_event);
          lVar8 = lVar8 + 1;
        } while (lVar8 != lVar1 + (ulong)(lVar1 == 0));
      }
      lVar1 = local_98;
      if (local_f8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_f8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::vector<midi_track,_std::allocator<midi_track>_>::push_back(this_00,&local_f8);
      }
      std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&local_d8.m_events);
      std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&local_f8.m_events);
      std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&local_90.m_events);
      local_98 = lVar1 + 1;
    } while (local_98 != local_a0);
  }
  return;
}

Assistant:

void midi_container::split_by_instrument_changes(split_callback cb)
{
    if (m_form != 1) /* This would literally die on anything else */
        return;

    for (unsigned long i = 0, j = m_tracks.size(); i < j; ++i)
    {
        midi_track source_track = m_tracks[0];

        m_tracks.erase(m_tracks.begin());

        midi_track output_track;
        midi_track program_change;

        for (unsigned long k = 0, l = source_track.get_count(); k < l; ++k)
        {
            const midi_event & event = source_track[ k ];
            if ( event.m_type == midi_event::program_change ||
               ( event.m_type == midi_event::control_change &&
                 (event.m_data[0] == 0 || event.m_data[0] == 0x20)))
            {
                program_change.add_event( event );
            }
            else
            {
                if (program_change.get_count())
                {
                    if (output_track.get_count())
                        m_tracks.push_back( output_track );
                    output_track = program_change;
					if (cb)
					{
						unsigned long timestamp = 0;
						uint8_t bank_msb = 0, bank_lsb = 0, instrument = 0;
						for (int i = 0, j = program_change.get_count(); i < j; ++i)
						{
							const midi_event & ev = program_change[i];
							if (ev.m_type == midi_event::program_change)
								instrument = ev.m_data[0];
							else if (ev.m_data[0] == 0)
								bank_msb = ev.m_data[1];
							else
								bank_lsb = ev.m_data[1];
							if (ev.m_timestamp > timestamp)
								timestamp = ev.m_timestamp;
						}

						std::string name = cb(bank_msb, bank_lsb, instrument);

						std::vector<uint8_t> data;

						data.resize(name.length() + 2);

						data[0] = 0xFF;
						data[1] = 0x03;

						std::copy(name.begin(), name.end(), data.begin() + 2);

						output_track.add_event(midi_event(timestamp, midi_event::extended, 0, &data[0], data.size()));
					}
					program_change = midi_track();
                }
                output_track.add_event( event );
            }
        }

        if (output_track.get_count())
            m_tracks.push_back(output_track);
    }
}